

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestSubmitHandler.cxx
# Opt level: O0

bool __thiscall
cmCTestSubmitHandler::SubmitUsingHTTP
          (cmCTestSubmitHandler *this,string *localprefix,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *files,string *remoteprefix,string *url)

{
  undefined1 *puVar1;
  cmCTest *pcVar2;
  string_view arg_00;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  reference pbVar7;
  CURL_conflict *data;
  char *pcVar8;
  undefined8 uVar9;
  ulong uVar10;
  ostream *poVar11;
  long lVar12;
  cmCTestScriptHandler *this_00;
  cmState *this_01;
  unsigned_long uVar13;
  void *pvVar14;
  size_type sVar15;
  string *psVar16;
  char ch_00;
  rep_conflict rVar17;
  int local_245c;
  string local_2218 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_21f8;
  undefined1 local_21d8 [8];
  ostringstream cmCTestLog_msg_13;
  string local_2060 [32];
  cmCTestLogWrite local_2040;
  undefined1 local_2030 [8];
  ostringstream cmCTestLog_msg_12;
  cmCTestLogWrite local_1eb8;
  string local_1ea8 [32];
  undefined1 local_1e88 [8];
  ostringstream cmCTestLog_msg_11;
  string local_1d10 [32];
  undefined1 local_1cf0 [8];
  ostringstream cmCTestLog_msg_10;
  vector<char,_std::allocator<char>_> local_1b78;
  string local_1b60 [32];
  cmCTestLogWrite local_1b40;
  undefined1 local_1b30 [8];
  ostringstream cmCTestLog_msg_9;
  string local_19b8 [32];
  undefined1 local_1998 [8];
  ostringstream cmCTestLog_msg_8;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_1820;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_1818;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>
  local_1810;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>
  stop;
  undefined1 local_17e8 [8];
  ostringstream cmCTestLog_msg_7;
  int local_1670;
  allocator<char> local_1669;
  int i;
  string local_1648;
  int local_1628;
  byte local_1624;
  byte local_1623;
  byte local_1622;
  allocator<char> local_1621;
  int count;
  string local_1600;
  int local_15dc;
  duration<double,_std::ratio<1L,_1L>_> local_15d8;
  cmDuration delay;
  string local_15c8;
  cmValue local_15a8;
  string local_15a0 [8];
  string retryCount;
  string local_1578;
  cmValue local_1558;
  string local_1550 [8];
  string retryDelay;
  cmCTestLogWrite local_1510;
  undefined1 local_1500 [8];
  ostringstream cmCTestLog_msg_6;
  vector<char,_std::allocator<char>_> local_1388;
  string local_1370 [32];
  cmCTestLogWrite local_1350;
  undefined1 local_1340 [8];
  ostringstream cmCTestLog_msg_5;
  undefined1 local_11c8 [8];
  cmCTestSubmitHandlerVectorOfChar chunkDebug;
  cmCTestSubmitHandlerVectorOfChar chunk;
  undefined1 local_1178 [8];
  ostringstream cmCTestLog_msg_4;
  unsigned_long filelen;
  string local_ff0 [32];
  undefined1 local_fd0 [8];
  ostringstream cmCTestLog_msg_3;
  string local_e58;
  allocator<char> local_e31;
  string local_e30;
  string *local_e10;
  string local_e08;
  allocator<char> local_de1;
  string local_de0;
  cmValue local_dc0;
  cmValue subproject;
  cmake *cm;
  cmCTestScriptHandler *ch;
  string local_d88;
  string local_d68;
  string local_d48;
  allocator<char> local_d21;
  string local_d20;
  string local_d00;
  string local_ce0;
  allocator<char> local_cb9;
  string local_cb8;
  string local_c98;
  string local_c78;
  undefined1 local_c58 [8];
  cmCTestCurl ctest_curl;
  cmAlphaNum local_bb0;
  undefined1 local_b80 [8];
  string upload_as;
  string ofile;
  undefined1 local_b20 [8];
  string remote_file;
  cmAlphaNum local_ad0;
  string local_aa0;
  byte local_a79;
  undefined1 local_a78 [7];
  bool initialize_cdash_buildid;
  string local_file;
  string local_a50 [4];
  int submitInactivityTimeout;
  undefined1 local_a30 [8];
  ostringstream cmCTestLog_msg_2;
  string local_8b8 [32];
  undefined1 local_898 [8];
  ostringstream cmCTestLog_msg_1;
  string local_720;
  string local_700;
  reference local_6e0;
  string *file;
  const_iterator __end1_2;
  const_iterator __begin1_2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1_2;
  string *arg;
  iterator __end1_1;
  iterator __begin1_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1_1;
  bool verifyHostOff;
  bool verifyPeerOff;
  undefined1 local_688 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  string local_668;
  undefined1 local_648 [8];
  string curlopt;
  ostringstream local_5f8 [8];
  ostringstream cmCTestLog_msg;
  string *h;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  curl_slist *headers;
  char error_buffer [1024];
  FILE *local_50;
  FILE *ftpfile;
  CURLcode res;
  CURL *curl;
  string *url_local;
  string *remoteprefix_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *files_local;
  string *localprefix_local;
  cmCTestSubmitHandler *this_local;
  
  __range1 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)curl_slist_append((curl_slist *)0x0,"Content-Type: text/xml");
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(&this->HttpHeaders);
  h = (string *)
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::end(&this->HttpHeaders);
  while (bVar4 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)&h), bVar4) {
    pbVar7 = __gnu_cxx::
             __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&__end1);
    std::__cxx11::ostringstream::ostringstream(local_5f8);
    poVar11 = std::operator<<((ostream *)local_5f8,"   Add HTTP Header: \"");
    poVar11 = std::operator<<(poVar11,(string *)pbVar7);
    poVar11 = std::operator<<(poVar11,"\"");
    std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
    pcVar2 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::ostringstream::str();
    pcVar8 = (char *)std::__cxx11::string::c_str();
    cmCTest::Log(pcVar2,0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
                 ,0x9c,pcVar8,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
    std::__cxx11::string::~string((string *)(curlopt.field_2._M_local_buf + 8));
    std::__cxx11::ostringstream::~ostringstream(local_5f8);
    pcVar8 = (char *)std::__cxx11::string::c_str();
    __range1 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)curl_slist_append((curl_slist *)__range1,pcVar8);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  }
  curl_global_init(3);
  pcVar2 = (this->super_cmCTestGenericHandler).CTest;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_668,"CurlOptions",
             (allocator<char> *)
             ((long)&args.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  cmCTest::GetCTestConfiguration((string *)local_648,pcVar2,&local_668);
  std::__cxx11::string::~string((string *)&local_668);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&args.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  arg_00 = (string_view)
           std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_648);
  cmExpandedList_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_688,arg_00,false);
  bVar4 = false;
  bVar3 = false;
  __end1_1 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_688);
  arg = (string *)
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_688);
  while (bVar5 = __gnu_cxx::operator!=
                           (&__end1_1,
                            (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)&arg), bVar5) {
    pbVar7 = __gnu_cxx::
             __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&__end1_1);
    bVar5 = std::operator==(pbVar7,"CURLOPT_SSL_VERIFYPEER_OFF");
    if (bVar5) {
      bVar4 = true;
    }
    bVar5 = std::operator==(pbVar7,"CURLOPT_SSL_VERIFYHOST_OFF");
    if (bVar5) {
      bVar3 = true;
    }
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1_1);
  }
  __end1_2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(files);
  file = (string *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(files);
  while (bVar5 = __gnu_cxx::operator!=
                           (&__end1_2,
                            (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)&file), bVar5) {
    local_6e0 = __gnu_cxx::
                __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator*(&__end1_2);
    data = curl_easy_init();
    if (data != (CURL_conflict *)0x0) {
      std::__cxx11::string::string((string *)&local_720);
      cmCurlSetCAInfo(&local_700,data,&local_720);
      std::__cxx11::string::~string((string *)&local_700);
      std::__cxx11::string::~string((string *)&local_720);
      if (bVar4) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_898);
        std::operator<<((ostream *)local_898,"  Set CURLOPT_SSL_VERIFYPEER to off\n");
        pcVar2 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::ostringstream::str();
        pcVar8 = (char *)std::__cxx11::string::c_str();
        cmCTest::Log(pcVar2,5,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
                     ,0xb6,pcVar8,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
        std::__cxx11::string::~string(local_8b8);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_898);
        curl_easy_setopt(data,CURLOPT_SSL_VERIFYPEER,0);
      }
      if (bVar3) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_a30);
        std::operator<<((ostream *)local_a30,"  Set CURLOPT_SSL_VERIFYHOST to off\n");
        pcVar2 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::ostringstream::str();
        pcVar8 = (char *)std::__cxx11::string::c_str();
        cmCTest::Log(pcVar2,5,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
                     ,0xbc,pcVar8,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
        std::__cxx11::string::~string(local_a50);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_a30);
        curl_easy_setopt(data,CURLOPT_SSL_VERIFYHOST,0);
      }
      if (0 < this->HTTPProxyType) {
        uVar9 = std::__cxx11::string::c_str();
        curl_easy_setopt(data,CURLOPT_PROXY,uVar9);
        if (this->HTTPProxyType == 2) {
          curl_easy_setopt(data,CURLOPT_PROXYTYPE,4);
        }
        else if (this->HTTPProxyType == 3) {
          curl_easy_setopt(data,CURLOPT_PROXYTYPE,5);
        }
        else {
          curl_easy_setopt(data,CURLOPT_PROXYTYPE,0);
          uVar10 = std::__cxx11::string::empty();
          if ((uVar10 & 1) == 0) {
            uVar9 = std::__cxx11::string::c_str();
            curl_easy_setopt(data,CURLOPT_PROXYUSERPWD,uVar9);
          }
        }
      }
      bVar5 = cmCTest::ShouldUseHTTP10((this->super_cmCTestGenericHandler).CTest);
      if (bVar5) {
        curl_easy_setopt(data,CURLOPT_HTTP_VERSION,1);
      }
      curl_easy_setopt(data,CURLOPT_FAILONERROR,1);
      curl_easy_setopt(data,CURLOPT_UPLOAD,1);
      curl_easy_setopt(data,CURLOPT_LOW_SPEED_LIMIT,1);
      local_file.field_2._12_4_ = GetSubmitInactivityTimeout(this);
      if (local_file.field_2._12_4_ != 0) {
        curl_easy_setopt(data,CURLOPT_LOW_SPEED_TIME,(ulong)(uint)local_file.field_2._12_4_);
      }
      curl_easy_setopt(data,CURLOPT_PUT,1);
      curl_easy_setopt(data,CURLOPT_VERBOSE,1);
      curl_easy_setopt(data,CURLOPT_HTTPHEADER,__range1);
      std::__cxx11::string::string((string *)local_a78,(string *)local_6e0);
      local_a79 = 0;
      bVar5 = cmsys::SystemTools::FileExists((string *)local_a78);
      if (!bVar5) {
        cmAlphaNum::cmAlphaNum(&local_ad0,localprefix);
        cmAlphaNum::cmAlphaNum((cmAlphaNum *)((long)&remote_file.field_2 + 8),"/");
        cmStrCat<std::__cxx11::string>
                  (&local_aa0,&local_ad0,(cmAlphaNum *)((long)&remote_file.field_2 + 8),local_6e0);
        std::__cxx11::string::operator=((string *)local_a78,(string *)&local_aa0);
        std::__cxx11::string::~string((string *)&local_aa0);
        local_a79 = 1;
      }
      cmsys::SystemTools::GetFilenameName((string *)((long)&ofile.field_2 + 8),local_6e0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b20,
                     remoteprefix,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&ofile.field_2 + 8));
      std::__cxx11::string::~string((string *)(ofile.field_2._M_local_buf + 8));
      poVar11 = std::operator<<(this->LogFile,"\tUpload file: ");
      poVar11 = std::operator<<(poVar11,(string *)local_a78);
      poVar11 = std::operator<<(poVar11," to ");
      poVar11 = std::operator<<(poVar11,(string *)local_b20);
      std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
      cmSystemTools::EncodeURL((string *)((long)&upload_as.field_2 + 8),(string *)local_b20,true);
      cmAlphaNum::cmAlphaNum(&local_bb0,url);
      lVar12 = std::__cxx11::string::find((char)url,0x3f);
      ch_00 = '&';
      if (lVar12 == -1) {
        ch_00 = '?';
      }
      cmAlphaNum::cmAlphaNum((cmAlphaNum *)&ctest_curl.TimeOutSeconds,ch_00);
      cmStrCat<char[10],std::__cxx11::string>
                ((string *)local_b80,&local_bb0,(cmAlphaNum *)&ctest_curl.TimeOutSeconds,
                 (char (*) [10])"FileName=",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&upload_as.field_2 + 8));
      if ((local_a79 & 1) != 0) {
        cmCTestCurl::cmCTestCurl((cmCTestCurl *)local_c58,(this->super_cmCTestGenericHandler).CTest)
        ;
        std::__cxx11::string::operator+=((string *)local_b80,"&build=");
        pcVar2 = (this->super_cmCTestGenericHandler).CTest;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_cb8,"BuildName",&local_cb9);
        cmCTest::GetCTestConfiguration(&local_c98,pcVar2,&local_cb8);
        cmCTestCurl::Escape(&local_c78,(cmCTestCurl *)local_c58,&local_c98);
        std::__cxx11::string::operator+=((string *)local_b80,(string *)&local_c78);
        std::__cxx11::string::~string((string *)&local_c78);
        std::__cxx11::string::~string((string *)&local_c98);
        std::__cxx11::string::~string((string *)&local_cb8);
        std::allocator<char>::~allocator(&local_cb9);
        std::__cxx11::string::operator+=((string *)local_b80,"&site=");
        pcVar2 = (this->super_cmCTestGenericHandler).CTest;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_d20,"Site",&local_d21);
        cmCTest::GetCTestConfiguration(&local_d00,pcVar2,&local_d20);
        cmCTestCurl::Escape(&local_ce0,(cmCTestCurl *)local_c58,&local_d00);
        std::__cxx11::string::operator+=((string *)local_b80,(string *)&local_ce0);
        std::__cxx11::string::~string((string *)&local_ce0);
        std::__cxx11::string::~string((string *)&local_d00);
        std::__cxx11::string::~string((string *)&local_d20);
        std::allocator<char>::~allocator(&local_d21);
        std::__cxx11::string::operator+=((string *)local_b80,"&stamp=");
        cmCTest::GetCurrentTag_abi_cxx11_(&local_d68,(this->super_cmCTestGenericHandler).CTest);
        cmCTestCurl::Escape(&local_d48,(cmCTestCurl *)local_c58,&local_d68);
        std::__cxx11::string::operator+=((string *)local_b80,(string *)&local_d48);
        std::__cxx11::string::~string((string *)&local_d48);
        std::__cxx11::string::~string((string *)&local_d68);
        std::__cxx11::string::operator+=((string *)local_b80,"-");
        cmCTest::GetTestModelString_abi_cxx11_
                  ((string *)&ch,(this->super_cmCTestGenericHandler).CTest);
        cmCTestCurl::Escape(&local_d88,(cmCTestCurl *)local_c58,(string *)&ch);
        std::__cxx11::string::operator+=((string *)local_b80,(string *)&local_d88);
        std::__cxx11::string::~string((string *)&local_d88);
        std::__cxx11::string::~string((string *)&ch);
        this_00 = cmCTest::GetScriptHandler((this->super_cmCTestGenericHandler).CTest);
        subproject.Value = (string *)cmCTestScriptHandler::GetCMake(this_00);
        if ((cmake *)subproject.Value != (cmake *)0x0) {
          this_01 = cmake::GetState((cmake *)subproject.Value);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_de0,"SubProject",&local_de1);
          local_dc0 = cmState::GetGlobalProperty(this_01,&local_de0);
          std::__cxx11::string::~string((string *)&local_de0);
          std::allocator<char>::~allocator(&local_de1);
          bVar5 = cmValue::operator_cast_to_bool(&local_dc0);
          if (bVar5) {
            std::__cxx11::string::operator+=((string *)local_b80,"&subproject=");
            psVar16 = cmValue::operator*[abi_cxx11_(&local_dc0);
            cmCTestCurl::Escape(&local_e08,(cmCTestCurl *)local_c58,psVar16);
            std::__cxx11::string::operator+=((string *)local_b80,(string *)&local_e08);
            std::__cxx11::string::~string((string *)&local_e08);
          }
        }
        cmCTestCurl::~cmCTestCurl((cmCTestCurl *)local_c58);
      }
      bVar5 = std::operator==(local_6e0,"Done.xml");
      if (bVar5) {
        cmCTest::GenerateDoneFile((this->super_cmCTestGenericHandler).CTest);
      }
      std::__cxx11::string::operator+=((string *)local_b80,"&MD5=");
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_e30,"InternalTest",&local_e31);
      local_e10 = (string *)
                  cmCTestGenericHandler::GetOption(&this->super_cmCTestGenericHandler,&local_e30);
      bVar5 = cmIsOn((cmValue)local_e10);
      std::__cxx11::string::~string((string *)&local_e30);
      std::allocator<char>::~allocator(&local_e31);
      if (bVar5) {
        std::__cxx11::string::operator+=((string *)local_b80,"bad_md5sum");
      }
      else {
        cmSystemTools::ComputeFileHash(&local_e58,(string *)local_a78,AlgoMD5);
        std::__cxx11::string::operator+=((string *)local_b80,(string *)&local_e58);
        std::__cxx11::string::~string((string *)&local_e58);
      }
      bVar5 = cmsys::SystemTools::FileExists((string *)local_a78);
      if (bVar5) {
        uVar13 = cmsys::SystemTools::FileLength((string *)local_a78);
        local_50 = (FILE *)cmsys::SystemTools::Fopen((string *)local_a78,"rb");
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1178);
        poVar11 = std::operator<<((ostream *)local_1178,"   Upload file: ");
        poVar11 = std::operator<<(poVar11,(string *)local_a78);
        poVar11 = std::operator<<(poVar11," to ");
        poVar11 = std::operator<<(poVar11,(string *)local_b80);
        poVar11 = std::operator<<(poVar11," Size: ");
        pvVar14 = (void *)std::ostream::operator<<(poVar11,uVar13);
        std::ostream::operator<<(pvVar14,std::endl<char,std::char_traits<char>>);
        pcVar2 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::ostringstream::str();
        pcVar8 = (char *)std::__cxx11::string::c_str();
        cmCTest::Log(pcVar2,5,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
                     ,0x137,pcVar8,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
        std::__cxx11::string::~string
                  ((string *)
                   &chunk.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1178);
        uVar9 = std::__cxx11::string::c_str();
        curl_easy_setopt(data,CURLOPT_URL,uVar9);
        curl_easy_setopt(data,CURLOPT_HTTPAUTH,0xffffffffffffffef);
        curl_easy_setopt(data,CURLOPT_READDATA,local_50);
        curl_easy_setopt(data,CURLOPT_INFILESIZE,uVar13);
        curl_easy_setopt(data,CURLOPT_ERRORBUFFER,&headers);
        curl_easy_setopt(data,CURLOPT_WRITEFUNCTION,cmCTestSubmitHandlerWriteMemoryCallback);
        curl_easy_setopt(data,CURLOPT_DEBUGFUNCTION,cmCTestSubmitHandlerCurlDebugCallback);
        puVar1 = &chunkDebug.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10;
        std::vector<char,_std::allocator<char>_>::vector
                  ((vector<char,_std::allocator<char>_> *)puVar1);
        std::vector<char,_std::allocator<char>_>::vector
                  ((vector<char,_std::allocator<char>_> *)local_11c8);
        curl_easy_setopt(data,CURLOPT_WRITEDATA,puVar1);
        curl_easy_setopt(data,CURLOPT_DEBUGDATA,local_11c8);
        ftpfile._4_4_ = curl_easy_perform(data);
        bVar5 = std::vector<char,_std::allocator<char>_>::empty
                          ((vector<char,_std::allocator<char>_> *)
                           &chunkDebug.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            field_0x10);
        if (!bVar5) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1340);
          poVar11 = std::operator<<((ostream *)local_1340,"CURL output: [");
          puVar1 = &chunkDebug.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10;
          pcVar8 = std::vector<char,_std::allocator<char>_>::data
                             ((vector<char,_std::allocator<char>_> *)puVar1);
          sVar15 = std::vector<char,_std::allocator<char>_>::size
                             ((vector<char,_std::allocator<char>_> *)puVar1);
          cmCTestLogWrite::cmCTestLogWrite(&local_1350,pcVar8,sVar15);
          poVar11 = ::operator<<(poVar11,&local_1350);
          poVar11 = std::operator<<(poVar11,"]");
          std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
          pcVar2 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::ostringstream::str();
          pcVar8 = (char *)std::__cxx11::string::c_str();
          cmCTest::Log(pcVar2,0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
                       ,0x15d,pcVar8,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
          std::__cxx11::string::~string(local_1370);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1340);
          std::vector<char,_std::allocator<char>_>::vector
                    (&local_1388,
                     (vector<char,_std::allocator<char>_> *)
                     &chunkDebug.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10)
          ;
          ParseResponse(this,&local_1388);
          std::vector<char,_std::allocator<char>_>::~vector(&local_1388);
        }
        bVar5 = std::vector<char,_std::allocator<char>_>::empty
                          ((vector<char,_std::allocator<char>_> *)local_11c8);
        if (!bVar5) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1500);
          poVar11 = std::operator<<((ostream *)local_1500,"CURL debug output: [");
          pcVar8 = std::vector<char,_std::allocator<char>_>::data
                             ((vector<char,_std::allocator<char>_> *)local_11c8);
          sVar15 = std::vector<char,_std::allocator<char>_>::size
                             ((vector<char,_std::allocator<char>_> *)local_11c8);
          cmCTestLogWrite::cmCTestLogWrite(&local_1510,pcVar8,sVar15);
          poVar11 = ::operator<<(poVar11,&local_1510);
          poVar11 = std::operator<<(poVar11,"]");
          std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
          pcVar2 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::ostringstream::str();
          pcVar8 = (char *)std::__cxx11::string::c_str();
          cmCTest::Log(pcVar2,0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
                       ,0x166,pcVar8,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
          std::__cxx11::string::~string((string *)(retryDelay.field_2._M_local_buf + 8));
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1500);
        }
        if ((ftpfile._4_4_ != CURLE_OK) || ((this->HasErrors & 1U) != 0)) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1578,"RetryDelay",
                     (allocator<char> *)(retryCount.field_2._M_local_buf + 0xf));
          local_1558 = cmCTestGenericHandler::GetOption
                                 (&this->super_cmCTestGenericHandler,&local_1578);
          psVar16 = cmValue::operator*[abi_cxx11_(&local_1558);
          std::__cxx11::string::string(local_1550,(string *)psVar16);
          std::__cxx11::string::~string((string *)&local_1578);
          std::allocator<char>::~allocator
                    ((allocator<char> *)(retryCount.field_2._M_local_buf + 0xf));
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_15c8,"RetryCount",(allocator<char> *)((long)&delay.__r + 7));
          local_15a8 = cmCTestGenericHandler::GetOption
                                 (&this->super_cmCTestGenericHandler,&local_15c8);
          psVar16 = cmValue::operator*[abi_cxx11_(&local_15a8);
          std::__cxx11::string::string(local_15a0,(string *)psVar16);
          std::__cxx11::string::~string((string *)&local_15c8);
          std::allocator<char>::~allocator((allocator<char> *)((long)&delay.__r + 7));
          uVar10 = std::__cxx11::string::empty();
          local_1622 = 0;
          local_1623 = 0;
          local_1624 = 0;
          if ((uVar10 & 1) == 0) {
            pcVar8 = (char *)std::__cxx11::string::c_str();
            local_245c = atoi(pcVar8);
          }
          else {
            pcVar2 = (this->super_cmCTestGenericHandler).CTest;
            std::allocator<char>::allocator();
            local_1622 = 1;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&count,"CTestSubmitRetryDelay",&local_1621);
            local_1623 = 1;
            cmCTest::GetCTestConfiguration(&local_1600,pcVar2,(string *)&count);
            local_1624 = 1;
            pcVar8 = (char *)std::__cxx11::string::c_str();
            local_245c = atoi(pcVar8);
          }
          local_15dc = local_245c;
          std::chrono::duration<double,std::ratio<1l,1l>>::duration<int,void>
                    ((duration<double,std::ratio<1l,1l>> *)&local_15d8,&local_15dc);
          if ((local_1624 & 1) != 0) {
            std::__cxx11::string::~string((string *)&local_1600);
          }
          if ((local_1623 & 1) != 0) {
            std::__cxx11::string::~string((string *)&count);
          }
          if ((local_1622 & 1) != 0) {
            std::allocator<char>::~allocator(&local_1621);
          }
          uVar10 = std::__cxx11::string::empty();
          if ((uVar10 & 1) == 0) {
            pcVar8 = (char *)std::__cxx11::string::c_str();
            local_1628 = atoi(pcVar8);
          }
          else {
            pcVar2 = (this->super_cmCTestGenericHandler).CTest;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&i,"CTestSubmitRetryCount",&local_1669);
            cmCTest::GetCTestConfiguration(&local_1648,pcVar2,(string *)&i);
            pcVar8 = (char *)std::__cxx11::string::c_str();
            iVar6 = atoi(pcVar8);
            std::__cxx11::string::~string((string *)&local_1648);
            std::__cxx11::string::~string((string *)&i);
            std::allocator<char>::~allocator(&local_1669);
            local_1628 = iVar6;
          }
          for (local_1670 = 0; local_1670 < local_1628; local_1670 = local_1670 + 1) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_17e8);
            poVar11 = std::operator<<((ostream *)local_17e8,"   Submit failed, waiting ");
            rVar17 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count(&local_15d8);
            poVar11 = (ostream *)std::ostream::operator<<(poVar11,rVar17);
            std::operator<<(poVar11," seconds...\n");
            pcVar2 = (this->super_cmCTestGenericHandler).CTest;
            std::__cxx11::ostringstream::str();
            pcVar8 = (char *)std::__cxx11::string::c_str();
            cmCTest::Log(pcVar2,2,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
                         ,0x17d,pcVar8,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
            std::__cxx11::string::~string((string *)&stop);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_17e8);
            local_1818.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
            local_1810 = std::chrono::operator+(&local_1818,&local_15d8);
            while( true ) {
              local_1820.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
              bVar5 = std::chrono::operator<(&local_1820,&local_1810);
              if (!bVar5) break;
              cmsys::SystemTools::Delay(100);
            }
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1998);
            poVar11 = std::operator<<((ostream *)local_1998,"   Retry submission: Attempt ");
            poVar11 = (ostream *)std::ostream::operator<<(poVar11,local_1670 + 1);
            poVar11 = std::operator<<(poVar11," of ");
            pvVar14 = (void *)std::ostream::operator<<(poVar11,local_1628);
            std::ostream::operator<<(pvVar14,std::endl<char,std::char_traits<char>>);
            pcVar2 = (this->super_cmCTestGenericHandler).CTest;
            std::__cxx11::ostringstream::str();
            pcVar8 = (char *)std::__cxx11::string::c_str();
            cmCTest::Log(pcVar2,2,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
                         ,0x187,pcVar8,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
            std::__cxx11::string::~string(local_19b8);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1998);
            fclose(local_50);
            local_50 = (FILE *)cmsys::SystemTools::Fopen((string *)local_a78,"rb");
            curl_easy_setopt(data,CURLOPT_READDATA,local_50);
            std::vector<char,_std::allocator<char>_>::clear
                      ((vector<char,_std::allocator<char>_> *)
                       &chunkDebug.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        field_0x10);
            std::vector<char,_std::allocator<char>_>::clear
                      ((vector<char,_std::allocator<char>_> *)local_11c8);
            this->HasErrors = false;
            ftpfile._4_4_ = curl_easy_perform(data);
            bVar5 = std::vector<char,_std::allocator<char>_>::empty
                              ((vector<char,_std::allocator<char>_> *)
                               &chunkDebug.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                field_0x10);
            if (!bVar5) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b30);
              poVar11 = std::operator<<((ostream *)local_1b30,"CURL output: [");
              puVar1 = &chunkDebug.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        field_0x10;
              pcVar8 = std::vector<char,_std::allocator<char>_>::data
                                 ((vector<char,_std::allocator<char>_> *)puVar1);
              sVar15 = std::vector<char,_std::allocator<char>_>::size
                                 ((vector<char,_std::allocator<char>_> *)puVar1);
              cmCTestLogWrite::cmCTestLogWrite(&local_1b40,pcVar8,sVar15);
              poVar11 = ::operator<<(poVar11,&local_1b40);
              poVar11 = std::operator<<(poVar11,"]");
              std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
              pcVar2 = (this->super_cmCTestGenericHandler).CTest;
              std::__cxx11::ostringstream::str();
              pcVar8 = (char *)std::__cxx11::string::c_str();
              cmCTest::Log(pcVar2,0,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
                           ,0x198,pcVar8,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
              std::__cxx11::string::~string(local_1b60);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b30);
              std::vector<char,_std::allocator<char>_>::vector
                        (&local_1b78,
                         (vector<char,_std::allocator<char>_> *)
                         &chunkDebug.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          field_0x10);
              ParseResponse(this,&local_1b78);
              std::vector<char,_std::allocator<char>_>::~vector(&local_1b78);
            }
            if ((ftpfile._4_4_ == CURLE_OK) && ((this->HasErrors & 1U) == 0)) break;
          }
          std::__cxx11::string::~string(local_15a0);
          std::__cxx11::string::~string(local_1550);
        }
        fclose(local_50);
        if (ftpfile._4_4_ == CURLE_OK) {
          curl_easy_cleanup(data);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_21d8);
          std::operator+(&local_21f8,"   Uploaded: ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_a78);
          poVar11 = std::operator<<((ostream *)local_21d8,(string *)&local_21f8);
          std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
          std::__cxx11::string::~string((string *)&local_21f8);
          pcVar2 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::ostringstream::str();
          pcVar8 = (char *)std::__cxx11::string::c_str();
          cmCTest::Log(pcVar2,2,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
                       ,0x1c0,pcVar8,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
          std::__cxx11::string::~string(local_2218);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_21d8);
          bVar5 = false;
        }
        else {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1cf0);
          poVar11 = std::operator<<((ostream *)local_1cf0,"   Error when uploading file: ");
          poVar11 = std::operator<<(poVar11,(string *)local_a78);
          std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
          pcVar2 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::ostringstream::str();
          pcVar8 = (char *)std::__cxx11::string::c_str();
          cmCTest::Log(pcVar2,7,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
                       ,0x1a6,pcVar8,false);
          std::__cxx11::string::~string(local_1d10);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1cf0);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e88);
          poVar11 = std::operator<<((ostream *)local_1e88,"   Error message was: ");
          poVar11 = std::operator<<(poVar11,(char *)&headers);
          std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
          pcVar2 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::ostringstream::str();
          pcVar8 = (char *)std::__cxx11::string::c_str();
          cmCTest::Log(pcVar2,7,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
                       ,0x1a8,pcVar8,false);
          std::__cxx11::string::~string(local_1ea8);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e88);
          poVar11 = std::operator<<(this->LogFile,"   Error when uploading file: ");
          poVar11 = std::operator<<(poVar11,(string *)local_a78);
          poVar11 = (ostream *)
                    std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
          poVar11 = std::operator<<(poVar11,"   Error message was: ");
          poVar11 = std::operator<<(poVar11,(char *)&headers);
          std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
          bVar5 = std::vector<char,_std::allocator<char>_>::empty
                            ((vector<char,_std::allocator<char>_> *)
                             &chunkDebug.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              field_0x10);
          if (!bVar5) {
            poVar11 = std::operator<<(this->LogFile,"   Curl output was: ");
            puVar1 = &chunkDebug.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10;
            pcVar8 = std::vector<char,_std::allocator<char>_>::data
                               ((vector<char,_std::allocator<char>_> *)puVar1);
            sVar15 = std::vector<char,_std::allocator<char>_>::size
                               ((vector<char,_std::allocator<char>_> *)puVar1);
            cmCTestLogWrite::cmCTestLogWrite(&local_1eb8,pcVar8,sVar15);
            poVar11 = ::operator<<(poVar11,&local_1eb8);
            std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2030);
            poVar11 = std::operator<<((ostream *)local_2030,"CURL output: [");
            puVar1 = &chunkDebug.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10;
            pcVar8 = std::vector<char,_std::allocator<char>_>::data
                               ((vector<char,_std::allocator<char>_> *)puVar1);
            sVar15 = std::vector<char,_std::allocator<char>_>::size
                               ((vector<char,_std::allocator<char>_> *)puVar1);
            cmCTestLogWrite::cmCTestLogWrite(&local_2040,pcVar8,sVar15);
            poVar11 = ::operator<<(poVar11,&local_2040);
            poVar11 = std::operator<<(poVar11,"]");
            std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
            pcVar2 = (this->super_cmCTestGenericHandler).CTest;
            std::__cxx11::ostringstream::str();
            pcVar8 = (char *)std::__cxx11::string::c_str();
            cmCTest::Log(pcVar2,7,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
                         ,0x1b5,pcVar8,false);
            std::__cxx11::string::~string(local_2060);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2030);
          }
          curl_easy_cleanup(data);
          curl_slist_free_all((curl_slist *)__range1);
          curl_global_cleanup();
          this_local._7_1_ = 0;
          bVar5 = true;
        }
        std::vector<char,_std::allocator<char>_>::~vector
                  ((vector<char,_std::allocator<char>_> *)local_11c8);
        std::vector<char,_std::allocator<char>_>::~vector
                  ((vector<char,_std::allocator<char>_> *)
                   &chunkDebug.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10);
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_fd0);
        poVar11 = std::operator<<((ostream *)local_fd0,"   Cannot find file: ");
        poVar11 = std::operator<<(poVar11,(string *)local_a78);
        std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
        pcVar2 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::ostringstream::str();
        pcVar8 = (char *)std::__cxx11::string::c_str();
        cmCTest::Log(pcVar2,7,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
                     ,0x12a,pcVar8,false);
        std::__cxx11::string::~string(local_ff0);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_fd0);
        curl_easy_cleanup(data);
        curl_slist_free_all((curl_slist *)__range1);
        curl_global_cleanup();
        this_local._7_1_ = 0;
        bVar5 = true;
      }
      std::__cxx11::string::~string((string *)local_b80);
      std::__cxx11::string::~string((string *)(upload_as.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)local_b20);
      std::__cxx11::string::~string((string *)local_a78);
      if (bVar5) goto LAB_0028219f;
    }
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1_2);
  }
  curl_slist_free_all((curl_slist *)__range1);
  curl_global_cleanup();
  this_local._7_1_ = 1;
LAB_0028219f:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_688);
  std::__cxx11::string::~string((string *)local_648);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmCTestSubmitHandler::SubmitUsingHTTP(
  const std::string& localprefix, const std::vector<std::string>& files,
  const std::string& remoteprefix, const std::string& url)
{
  CURL* curl;
  CURLcode res;
  FILE* ftpfile;
  char error_buffer[1024];
  // Set Content-Type to satisfy fussy modsecurity rules.
  struct curl_slist* headers =
    ::curl_slist_append(nullptr, "Content-Type: text/xml");

  // Add any additional headers that the user specified.
  for (std::string const& h : this->HttpHeaders) {
    cmCTestOptionalLog(this->CTest, DEBUG,
                       "   Add HTTP Header: \"" << h << "\"" << std::endl,
                       this->Quiet);
    headers = ::curl_slist_append(headers, h.c_str());
  }

  /* In windows, this will init the winsock stuff */
  ::curl_global_init(CURL_GLOBAL_ALL);
  std::string curlopt(this->CTest->GetCTestConfiguration("CurlOptions"));
  std::vector<std::string> args = cmExpandedList(curlopt);
  bool verifyPeerOff = false;
  bool verifyHostOff = false;
  for (std::string const& arg : args) {
    if (arg == "CURLOPT_SSL_VERIFYPEER_OFF") {
      verifyPeerOff = true;
    }
    if (arg == "CURLOPT_SSL_VERIFYHOST_OFF") {
      verifyHostOff = true;
    }
  }
  for (std::string const& file : files) {
    /* get a curl handle */
    curl = curl_easy_init();
    if (curl) {
      cmCurlSetCAInfo(curl);
      if (verifyPeerOff) {
        cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                           "  Set CURLOPT_SSL_VERIFYPEER to off\n",
                           this->Quiet);
        curl_easy_setopt(curl, CURLOPT_SSL_VERIFYPEER, 0);
      }
      if (verifyHostOff) {
        cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                           "  Set CURLOPT_SSL_VERIFYHOST to off\n",
                           this->Quiet);
        curl_easy_setopt(curl, CURLOPT_SSL_VERIFYHOST, 0);
      }

      // Using proxy
      if (this->HTTPProxyType > 0) {
        curl_easy_setopt(curl, CURLOPT_PROXY, this->HTTPProxy.c_str());
        switch (this->HTTPProxyType) {
          case 2:
            curl_easy_setopt(curl, CURLOPT_PROXYTYPE, CURLPROXY_SOCKS4);
            break;
          case 3:
            curl_easy_setopt(curl, CURLOPT_PROXYTYPE, CURLPROXY_SOCKS5);
            break;
          default:
            curl_easy_setopt(curl, CURLOPT_PROXYTYPE, CURLPROXY_HTTP);
            if (!this->HTTPProxyAuth.empty()) {
              curl_easy_setopt(curl, CURLOPT_PROXYUSERPWD,
                               this->HTTPProxyAuth.c_str());
            }
        }
      }
      if (this->CTest->ShouldUseHTTP10()) {
        curl_easy_setopt(curl, CURLOPT_HTTP_VERSION, CURL_HTTP_VERSION_1_0);
      }
      // enable HTTP ERROR parsing
      curl_easy_setopt(curl, CURLOPT_FAILONERROR, 1);
      /* enable uploading */
      curl_easy_setopt(curl, CURLOPT_UPLOAD, 1);

      // if there is little to no activity for too long stop submitting
      ::curl_easy_setopt(curl, CURLOPT_LOW_SPEED_LIMIT, 1);
      auto submitInactivityTimeout = this->GetSubmitInactivityTimeout();
      if (submitInactivityTimeout != 0) {
        ::curl_easy_setopt(curl, CURLOPT_LOW_SPEED_TIME,
                           submitInactivityTimeout);
      }

      /* HTTP PUT please */
      ::curl_easy_setopt(curl, CURLOPT_PUT, 1);
      ::curl_easy_setopt(curl, CURLOPT_VERBOSE, 1);

      ::curl_easy_setopt(curl, CURLOPT_HTTPHEADER, headers);

      std::string local_file = file;
      bool initialize_cdash_buildid = false;
      if (!cmSystemTools::FileExists(local_file)) {
        local_file = cmStrCat(localprefix, "/", file);
        // If this file exists within the local Testing directory we assume
        // that it will be associated with the current build in CDash.
        initialize_cdash_buildid = true;
      }
      std::string remote_file =
        remoteprefix + cmSystemTools::GetFilenameName(file);

      *this->LogFile << "\tUpload file: " << local_file << " to "
                     << remote_file << std::endl;

      std::string ofile = cmSystemTools::EncodeURL(remote_file);
      std::string upload_as =
        cmStrCat(url, ((url.find('?') == std::string::npos) ? '?' : '&'),
                 "FileName=", ofile);

      if (initialize_cdash_buildid) {
        // Provide extra arguments to CDash so that it can initialize and
        // return a buildid.
        cmCTestCurl ctest_curl(this->CTest);
        upload_as += "&build=";
        upload_as +=
          ctest_curl.Escape(this->CTest->GetCTestConfiguration("BuildName"));
        upload_as += "&site=";
        upload_as +=
          ctest_curl.Escape(this->CTest->GetCTestConfiguration("Site"));
        upload_as += "&stamp=";
        upload_as += ctest_curl.Escape(this->CTest->GetCurrentTag());
        upload_as += "-";
        upload_as += ctest_curl.Escape(this->CTest->GetTestModelString());
        cmCTestScriptHandler* ch = this->CTest->GetScriptHandler();
        cmake* cm = ch->GetCMake();
        if (cm) {
          cmValue subproject = cm->GetState()->GetGlobalProperty("SubProject");
          if (subproject) {
            upload_as += "&subproject=";
            upload_as += ctest_curl.Escape(*subproject);
          }
        }
      }

      // Generate Done.xml right before it is submitted.
      // The reason for this is two-fold:
      // 1) It must be generated after some other part has been submitted
      //    so we have a buildId to refer to in its contents.
      // 2) By generating Done.xml here its timestamp will be as late as
      //    possible. This gives us a more accurate record of how long the
      //    entire build took to complete.
      if (file == "Done.xml") {
        this->CTest->GenerateDoneFile();
      }

      upload_as += "&MD5=";

      if (cmIsOn(this->GetOption("InternalTest"))) {
        upload_as += "bad_md5sum";
      } else {
        upload_as +=
          cmSystemTools::ComputeFileHash(local_file, cmCryptoHash::AlgoMD5);
      }

      if (!cmSystemTools::FileExists(local_file)) {
        cmCTestLog(this->CTest, ERROR_MESSAGE,
                   "   Cannot find file: " << local_file << std::endl);
        ::curl_easy_cleanup(curl);
        ::curl_slist_free_all(headers);
        ::curl_global_cleanup();
        return false;
      }
      unsigned long filelen = cmSystemTools::FileLength(local_file);

      ftpfile = cmsys::SystemTools::Fopen(local_file, "rb");
      cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                         "   Upload file: " << local_file << " to "
                                            << upload_as << " Size: "
                                            << filelen << std::endl,
                         this->Quiet);

      // specify target
      ::curl_easy_setopt(curl, CURLOPT_URL, upload_as.c_str());

      // CURLAUTH_BASIC is default, and here we allow additional methods,
      // including more secure ones
      ::curl_easy_setopt(curl, CURLOPT_HTTPAUTH, CURLAUTH_ANY);

      // now specify which file to upload
      ::curl_easy_setopt(curl, CURLOPT_INFILE, ftpfile);

      // and give the size of the upload (optional)
      ::curl_easy_setopt(curl, CURLOPT_INFILESIZE, static_cast<long>(filelen));

      // and give curl the buffer for errors
      ::curl_easy_setopt(curl, CURLOPT_ERRORBUFFER, &error_buffer);

      // specify handler for output
      ::curl_easy_setopt(curl, CURLOPT_WRITEFUNCTION,
                         cmCTestSubmitHandlerWriteMemoryCallback);
      ::curl_easy_setopt(curl, CURLOPT_DEBUGFUNCTION,
                         cmCTestSubmitHandlerCurlDebugCallback);

      /* we pass our 'chunk' struct to the callback function */
      cmCTestSubmitHandlerVectorOfChar chunk;
      cmCTestSubmitHandlerVectorOfChar chunkDebug;
      ::curl_easy_setopt(curl, CURLOPT_FILE, &chunk);
      ::curl_easy_setopt(curl, CURLOPT_DEBUGDATA, &chunkDebug);

      // Now run off and do what you've been told!
      res = ::curl_easy_perform(curl);

      if (!chunk.empty()) {
        cmCTestOptionalLog(this->CTest, DEBUG,
                           "CURL output: ["
                             << cmCTestLogWrite(chunk.data(), chunk.size())
                             << "]" << std::endl,
                           this->Quiet);
        this->ParseResponse(chunk);
      }
      if (!chunkDebug.empty()) {
        cmCTestOptionalLog(
          this->CTest, DEBUG,
          "CURL debug output: ["
            << cmCTestLogWrite(chunkDebug.data(), chunkDebug.size()) << "]"
            << std::endl,
          this->Quiet);
      }

      // If curl failed for any reason, or checksum fails, wait and retry
      //
      if (res != CURLE_OK || this->HasErrors) {
        std::string retryDelay = *this->GetOption("RetryDelay");
        std::string retryCount = *this->GetOption("RetryCount");

        auto delay = cmDuration(
          retryDelay.empty()
            ? atoi(this->CTest->GetCTestConfiguration("CTestSubmitRetryDelay")
                     .c_str())
            : atoi(retryDelay.c_str()));
        int count = retryCount.empty()
          ? atoi(this->CTest->GetCTestConfiguration("CTestSubmitRetryCount")
                   .c_str())
          : atoi(retryCount.c_str());

        for (int i = 0; i < count; i++) {
          cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT,
                             "   Submit failed, waiting " << delay.count()
                                                          << " seconds...\n",
                             this->Quiet);

          auto stop = std::chrono::steady_clock::now() + delay;
          while (std::chrono::steady_clock::now() < stop) {
            cmSystemTools::Delay(100);
          }

          cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT,
                             "   Retry submission: Attempt "
                               << (i + 1) << " of " << count << std::endl,
                             this->Quiet);

          ::fclose(ftpfile);
          ftpfile = cmsys::SystemTools::Fopen(local_file, "rb");
          ::curl_easy_setopt(curl, CURLOPT_INFILE, ftpfile);

          chunk.clear();
          chunkDebug.clear();
          this->HasErrors = false;

          res = ::curl_easy_perform(curl);

          if (!chunk.empty()) {
            cmCTestOptionalLog(this->CTest, DEBUG,
                               "CURL output: ["
                                 << cmCTestLogWrite(chunk.data(), chunk.size())
                                 << "]" << std::endl,
                               this->Quiet);
            this->ParseResponse(chunk);
          }

          if (res == CURLE_OK && !this->HasErrors) {
            break;
          }
        }
      }

      fclose(ftpfile);
      if (res) {
        cmCTestLog(this->CTest, ERROR_MESSAGE,
                   "   Error when uploading file: " << local_file
                                                    << std::endl);
        cmCTestLog(this->CTest, ERROR_MESSAGE,
                   "   Error message was: " << error_buffer << std::endl);
        *this->LogFile << "   Error when uploading file: " << local_file
                       << std::endl
                       << "   Error message was: " << error_buffer
                       << std::endl;
        // avoid deref of begin for zero size array
        if (!chunk.empty()) {
          *this->LogFile << "   Curl output was: "
                         << cmCTestLogWrite(chunk.data(), chunk.size())
                         << std::endl;
          cmCTestLog(this->CTest, ERROR_MESSAGE,
                     "CURL output: ["
                       << cmCTestLogWrite(chunk.data(), chunk.size()) << "]"
                       << std::endl);
        }
        ::curl_easy_cleanup(curl);
        ::curl_slist_free_all(headers);
        ::curl_global_cleanup();
        return false;
      }
      // always cleanup
      ::curl_easy_cleanup(curl);
      cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT,
                         "   Uploaded: " + local_file << std::endl,
                         this->Quiet);
    }
  }
  ::curl_slist_free_all(headers);
  ::curl_global_cleanup();
  return true;
}